

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O0

void __thiscall glslang::TPpContext::pop_include(TPpContext *this)

{
  value_type pIVar1;
  bool bVar2;
  reference ppIVar3;
  IncludeResult *include;
  TPpContext *this_local;
  
  ppIVar3 = std::
            stack<glslang::TShader::Includer::IncludeResult_*,_std::deque<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>_>
            ::top(&this->includeStack);
  pIVar1 = *ppIVar3;
  std::
  stack<glslang::TShader::Includer::IncludeResult_*,_std::deque<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>_>
  ::pop(&this->includeStack);
  (*this->includer->_vptr_Includer[2])(this->includer,pIVar1);
  bVar2 = std::
          stack<glslang::TShader::Includer::IncludeResult_*,_std::deque<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>_>
          ::empty(&this->includeStack);
  if (bVar2) {
    std::__cxx11::string::operator=
              ((string *)&this->currentSourceFile,(string *)&this->rootFileName);
  }
  else {
    ppIVar3 = std::
              stack<glslang::TShader::Includer::IncludeResult_*,_std::deque<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>_>
              ::top(&this->includeStack);
    std::__cxx11::string::operator=((string *)&this->currentSourceFile,(string *)*ppIVar3);
  }
  return;
}

Assistant:

void pop_include()
    {
        TShader::Includer::IncludeResult* include = includeStack.top();
        includeStack.pop();
        includer.releaseInclude(include);
        if (includeStack.empty()) {
            currentSourceFile = rootFileName;
        } else {
            currentSourceFile = includeStack.top()->headerName;
        }
    }